

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int *piVar25;
  double **ppdVar26;
  double *pdVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  if (0 < partitionCount) {
    uVar33 = 0;
    do {
      piVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
      iVar21 = piVar25[partitionIndices[uVar33]];
      iVar22 = piVar25[(long)partitionIndices[uVar33] + 1];
      iVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).kStateCount;
      memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp + iVar23 * iVar21,0,
             (long)((iVar22 - iVar21) * iVar23) << 3);
      iVar23 = childBufferIndices[uVar33];
      ppdVar26 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
      pdVar27 = ppdVar26[parentBufferIndices[uVar33]];
      pdVar41 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices
                [probabilityIndices[uVar33]];
      pdVar28 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights
                [categoryWeightsIndices[uVar33]];
      if ((iVar23 < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
         (piVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[iVar23],
         piVar25 != (int *)0x0)) {
        lVar38 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
        if (0 < lVar38) {
          iVar35 = iVar21 * 4;
          pdVar29 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          iVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
          iVar37 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
          lVar32 = 0;
          iVar34 = 0;
          iVar36 = iVar35;
          do {
            if (iVar21 < iVar22) {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = pdVar28[lVar32];
              lVar40 = 0;
              lVar39 = (long)iVar22 - (long)iVar21;
              do {
                iVar24 = *(int *)((long)piVar25 + lVar40 + (long)iVar21 * 4);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = pdVar29[iVar35 + lVar40];
                auVar52._8_8_ = 0;
                auVar52._0_8_ = pdVar41[iVar24 + iVar34] * pdVar27[iVar36 + lVar40];
                auVar49 = vfmadd213sd_fma(auVar52,auVar48,auVar10);
                pdVar29[iVar35 + lVar40] = auVar49._0_8_;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = pdVar29[(long)iVar35 + lVar40 + 1];
                auVar53._8_8_ = 0;
                auVar53._0_8_ = pdVar41[iVar34 + 5 + iVar24] * pdVar27[(long)iVar36 + lVar40 + 1];
                auVar49 = vfmadd213sd_fma(auVar53,auVar48,auVar11);
                pdVar29[(long)iVar35 + lVar40 + 1] = auVar49._0_8_;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = pdVar29[(long)iVar35 + lVar40 + 2];
                auVar54._8_8_ = 0;
                auVar54._0_8_ = pdVar41[iVar34 + 10 + iVar24] * pdVar27[(long)iVar36 + lVar40 + 2];
                auVar49 = vfmadd213sd_fma(auVar54,auVar48,auVar12);
                pdVar29[(long)iVar35 + lVar40 + 2] = auVar49._0_8_;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = pdVar29[(long)iVar35 + lVar40 + 3];
                auVar55._8_8_ = 0;
                auVar55._0_8_ = pdVar41[iVar24 + iVar34 + 0xf] * pdVar27[(long)iVar36 + lVar40 + 3];
                auVar49 = vfmadd213sd_fma(auVar55,auVar48,auVar13);
                pdVar29[(long)iVar35 + lVar40 + 3] = auVar49._0_8_;
                lVar40 = lVar40 + 4;
                lVar39 = lVar39 + -1;
              } while (lVar39 != 0);
              iVar36 = iVar36 + (int)lVar40;
            }
            iVar36 = iVar36 + ((iVar21 - iVar22) + iVar23 + iVar37) * 4;
            iVar34 = iVar34 + 0x14;
            lVar32 = lVar32 + 1;
          } while (lVar32 != lVar38);
        }
      }
      else {
        lVar38 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
        if (0 < lVar38) {
          pdVar29 = ppdVar26[iVar23];
          iVar36 = iVar21 * 4;
          iVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
          pdVar30 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          lVar39 = 0;
          lVar32 = 0;
          iVar37 = iVar36;
          do {
            if (iVar21 < iVar22) {
              lVar40 = (long)iVar37;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = pdVar28[lVar39];
              auVar56._8_8_ = 0;
              auVar56._0_8_ = pdVar41[lVar32];
              auVar61._8_8_ = 0;
              auVar61._0_8_ = pdVar41[lVar32 + 1];
              auVar62._8_8_ = 0;
              auVar62._0_8_ = pdVar41[lVar32 + 2];
              auVar63._8_8_ = 0;
              auVar63._0_8_ = pdVar41[lVar32 + 3];
              auVar64._8_8_ = 0;
              auVar64._0_8_ = pdVar41[lVar32 + 5];
              auVar65._8_8_ = 0;
              auVar65._0_8_ = pdVar41[lVar32 + 6];
              auVar66._8_8_ = 0;
              auVar66._0_8_ = pdVar41[lVar32 + 7];
              auVar67._8_8_ = 0;
              auVar67._0_8_ = pdVar41[lVar32 + 8];
              auVar68._8_8_ = 0;
              auVar68._0_8_ = pdVar41[lVar32 + 10];
              auVar69._8_8_ = 0;
              auVar69._0_8_ = pdVar41[lVar32 + 0xb];
              auVar70._8_8_ = 0;
              auVar70._0_8_ = pdVar41[lVar32 + 0xc];
              auVar71._8_8_ = 0;
              auVar71._0_8_ = pdVar41[lVar32 + 0xd];
              auVar72._8_8_ = 0;
              auVar72._0_8_ = pdVar41[lVar32 + 0xf];
              auVar73._8_8_ = 0;
              auVar73._0_8_ = pdVar41[lVar32 + 0x10];
              auVar74._8_8_ = 0;
              auVar74._0_8_ = pdVar41[lVar32 + 0x11];
              dVar6 = pdVar41[lVar32 + 0x12];
              lVar31 = 0x18;
              iVar34 = iVar22 - iVar21;
              do {
                uVar2 = *(ulong *)((long)pdVar29 + lVar31 + lVar40 * 8 + -0x18);
                uVar3 = *(ulong *)((long)pdVar29 + lVar31 + lVar40 * 8 + -0x10);
                uVar4 = *(ulong *)((long)pdVar29 + lVar31 + lVar40 * 8 + -8);
                uVar5 = *(ulong *)((long)pdVar29 + lVar31 + lVar40 * 8);
                auVar78._8_8_ = 0;
                auVar78._0_8_ = uVar3;
                auVar42 = vmulsd_avx512f(auVar61,auVar78);
                auVar76._8_8_ = 0;
                auVar76._0_8_ = uVar2;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar56,auVar76);
                auVar80._8_8_ = 0;
                auVar80._0_8_ = uVar4;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar62,auVar80);
                auVar82._8_8_ = 0;
                auVar82._0_8_ = uVar5;
                auVar43 = vfmadd231sd_avx512f(auVar42,auVar63,auVar82);
                auVar42 = vmulsd_avx512f(auVar65,auVar78);
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar64,auVar76);
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar66,auVar80);
                auVar44 = vfmadd231sd_avx512f(auVar42,auVar67,auVar82);
                auVar79._8_8_ = 0;
                auVar79._0_8_ = uVar3;
                auVar42 = vmulsd_avx512f(auVar69,auVar79);
                auVar77._8_8_ = 0;
                auVar77._0_8_ = uVar2;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar68,auVar77);
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar4;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar70,auVar81);
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar5;
                auVar45 = vfmadd231sd_avx512f(auVar42,auVar71,auVar83);
                auVar42 = vmulsd_avx512f(auVar73,auVar79);
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar72,auVar77);
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar74,auVar81);
                auVar75._8_8_ = 0;
                auVar75._0_8_ = dVar6;
                auVar46 = vfmadd231sd_avx512f(auVar42,auVar75,auVar83);
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)((long)pdVar27 + lVar31 + lVar40 * 8 + -0x18);
                auVar42 = vmulsd_avx512f(auVar43,auVar42);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -0x18);
                auVar42 = vfmadd213sd_avx512f(auVar42,auVar49,auVar43);
                puVar1 = (undefined8 *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -0x18);
                vmovsd_avx512f(auVar42);
                *puVar1 = *puVar1;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = *(ulong *)((long)pdVar27 + lVar31 + lVar40 * 8 + -0x10);
                auVar42 = vmulsd_avx512f(auVar44,auVar14);
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *(ulong *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -0x10);
                auVar42 = vfmadd213sd_avx512f(auVar42,auVar49,auVar44);
                puVar1 = (undefined8 *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -0x10);
                vmovsd_avx512f(auVar42);
                *puVar1 = *puVar1;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = *(ulong *)((long)pdVar27 + lVar31 + lVar40 * 8 + -8);
                auVar42 = vmulsd_avx512f(auVar45,auVar15);
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -8);
                auVar42 = vfmadd213sd_avx512f(auVar42,auVar49,auVar45);
                puVar1 = (undefined8 *)((long)pdVar30 + lVar31 + (long)iVar36 * 8 + -8);
                vmovsd_avx512f(auVar42);
                *puVar1 = *puVar1;
                auVar16._8_8_ = 0;
                auVar16._0_8_ = *(ulong *)((long)pdVar27 + lVar31 + lVar40 * 8);
                auVar42 = vmulsd_avx512f(auVar46,auVar16);
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)((long)pdVar30 + lVar31 + (long)iVar36 * 8);
                auVar42 = vfmadd213sd_avx512f(auVar42,auVar49,auVar46);
                puVar1 = (undefined8 *)((long)pdVar30 + lVar31 + (long)iVar36 * 8);
                vmovsd_avx512f(auVar42);
                *puVar1 = *puVar1;
                lVar31 = lVar31 + 0x20;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            lVar32 = lVar32 + 0x14;
            lVar39 = lVar39 + 1;
            iVar37 = iVar37 + iVar23 * 4;
          } while (lVar39 != lVar38);
        }
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != (uint)partitionCount);
  }
  if (0 < partitionCount) {
    pdVar27 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    uVar33 = 0;
    do {
      piVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
      iVar21 = piVar25[partitionIndices[uVar33]];
      lVar32 = (long)iVar21;
      iVar22 = piVar25[(long)partitionIndices[uVar33] + 1];
      lVar38 = (long)iVar22;
      iVar23 = cumulativeScaleIndices[uVar33];
      if (iVar21 < iVar22) {
        pdVar41 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies
                  [stateFrequenciesIndices[uVar33]];
        dVar6 = *pdVar41;
        dVar7 = pdVar41[1];
        dVar8 = pdVar41[2];
        dVar9 = pdVar41[3];
        pdVar41 = pdVar27 + (long)(iVar21 * 4) + 3;
        lVar39 = lVar32;
        do {
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar6;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = pdVar41[-3];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = dVar7 * pdVar41[-2];
          auVar49 = vfmadd231sd_fma(auVar50,auVar57,auVar17);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = dVar8;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = pdVar41[-1];
          auVar49 = vfmadd231sd_fma(auVar49,auVar58,auVar18);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = dVar9;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *pdVar41;
          auVar49 = vfmadd231sd_fma(auVar49,auVar59,auVar19);
          dVar47 = log(auVar49._0_8_);
          (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp[lVar39] = dVar47;
          lVar39 = lVar39 + 1;
          pdVar41 = pdVar41 + 4;
        } while (lVar38 != lVar39);
      }
      if ((iVar23 != -1) && (iVar21 < iVar22)) {
        pdVar41 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[iVar23];
        pdVar28 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
        lVar39 = lVar32;
        do {
          pdVar28[lVar39] = pdVar41[lVar39] + pdVar28[lVar39];
          lVar39 = lVar39 + 1;
        } while (lVar38 != lVar39);
      }
      outSumLogLikelihoodByPartition[uVar33] = 0.0;
      if (iVar21 < iVar22) {
        pdVar41 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
        pdVar28 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
        auVar51 = ZEXT864(0) << 0x40;
        do {
          auVar60._8_8_ = 0;
          auVar60._0_8_ = pdVar28[lVar32];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = pdVar41[lVar32];
          auVar49 = vfmadd231sd_fma(auVar51._0_16_,auVar60,auVar20);
          auVar51 = ZEXT1664(auVar49);
          outSumLogLikelihoodByPartition[uVar33] = auVar49._0_8_;
          lVar32 = lVar32 + 1;
        } while (lVar38 != lVar32);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                          const int* parentBufferIndices,
                                                          const int* childBufferIndices,
                                                          const int* probabilityIndices,
                                                          const int* categoryWeightsIndices,
                                                          const int* stateFrequenciesIndices,
                                                          const int* cumulativeScaleIndices,
                                                          const int* partitionIndices,
                                                          int partitionCount,
                                                          double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * 4; // Index for parent partials
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];

                    integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
            }
        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
        #if 0//
            int v = 0;
        #endif
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4;
          #if 1//
          int v = l*kPaddedPatternCount*4 + startPattern * 4;
          #endif
                const REALTYPE weight = wt[l];

                PREFETCH_MATRIX(1,transMatrix,w);

                for(int k = startPattern; k < endPattern; k++) {

                    const REALTYPE* partials1 = partialsChild;

                    PREFETCH_PARTIALS(1,partials1,v);

                    DO_INTEGRATION(1);

                    integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
          #if 0//
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
          #endif//
            }
        }
    }

    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}